

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseSession.cpp
# Opt level: O2

Result __thiscall
tonk::ApplicationSession::tonk_connect
          (ApplicationSession *this,TonkConnectionConfig config,char *serverHostname,
          uint16_t serverPort,TonkConnection *connectionOut)

{
  undefined8 uVar1;
  Connection *this_00;
  _func_int **pp_Var2;
  undefined8 *in_R8;
  undefined1 auVar3 [32];
  allocator local_b1;
  undefined1 local_b0 [16];
  string local_a0;
  char *local_80;
  undefined1 local_78 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68 [3];
  undefined1 local_50 [16];
  undefined4 local_40;
  IUDPSender *local_38;
  
  MakeCallbacksOptional(&config);
  (this->super_INATPortPool)._vptr_INATPortPool = (_func_int **)0x0;
  this_00 = (Connection *)operator_new(0xc930,(nothrow_t *)&std::nothrow);
  local_b0._8_8_ = in_R8;
  if (this_00 == (Connection *)0x0) {
    *in_R8 = 0;
    std::__cxx11::string::string((string *)&local_a0,"Out of memory",&local_b1);
    pp_Var2 = (_func_int **)operator_new(0x38);
    *pp_Var2 = (_func_int *)"ApplicationSession::tonk_connect";
    std::__cxx11::string::string((string *)(pp_Var2 + 1),(string *)&local_a0);
    *(undefined4 *)(pp_Var2 + 5) = 0;
    pp_Var2[6] = (_func_int *)0x2;
    (this->super_INATPortPool)._vptr_INATPortPool = pp_Var2;
    local_b0._0_8_ = (ErrorResult *)0x0;
    Result::~Result((Result *)local_b0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    Connection::Connection(this_00);
    auVar3 = vpbroadcastq_avx512vl();
    local_a0 = (string)vpaddq_avx2(auVar3,_DAT_001a1720);
    *in_R8 = this_00;
    local_80 = serverHostname + 0x39d0;
    local_78._0_8_ = *(undefined8 *)(serverHostname + 0x3ab8);
    std::__shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
               (__shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2> *)(serverHostname + 0x60)
              );
    local_68[1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40 = 0;
    local_50 = (undefined1  [16])0x0;
    local_68[2]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
    local_38 = (IUDPSender *)serverHostname;
    Connection::InitializeOutgoingConnection
              ((Connection *)local_b0,(Dependencies *)this_00,(TonkSocketConfig *)&local_a0,
               (TonkConnectionConfig *)(serverHostname + 0x3800),(char *)&config,serverPort);
    uVar1 = local_b0._0_8_;
    local_b0._0_8_ = (ErrorResult *)0x0;
    (this->super_INATPortPool)._vptr_INATPortPool = (_func_int **)uVar1;
    Result::~Result((Result *)local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_68);
    if ((ErrorResult *)uVar1 == (ErrorResult *)0x0) {
      return (Result)(ErrorResult *)this;
    }
    (*(this_00->super_IConnection)._vptr_IConnection[1])(this_00);
  }
  *(undefined8 *)local_b0._8_8_ = 0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result ApplicationSession::tonk_connect(
    TonkConnectionConfig config,
    const char* serverHostname,
    uint16_t serverPort,
    TonkConnection* connectionOut)
{
    MakeCallbacksOptional(config);

    Result result;

    Connection* connection = new (std::nothrow) Connection;
    *connectionOut = reinterpret_cast<TonkConnection>(connection);

    if (!connection)
        result = Result("ApplicationSession::tonk_connect", "Out of memory", ErrorType::Tonk);
    else
    {
        result = connection->InitializeOutgoingConnection({
            &SelfRefCount,
            &MainSocket,
            &MainSocket.AddressMap,
            &IdMap,
            &P2PKeyMap,
            MappedPort.get(),
            Context,
            nullptr, // No FloodDetector backref for outgoing connections
            UDPAddress(), // No Disconnect addr key
            this
        },
            &Config,
            config,
            serverHostname,
            serverPort);
    }

    if (result.IsFail())
    {
        delete connection;
        *connectionOut = nullptr;
    }

    return result;
}